

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  pointer pcVar1;
  size_t __n;
  size_type *psVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  string local_pname;
  size_type *local_f0;
  size_t local_e8;
  size_type local_e0 [2];
  long *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  long *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  long *local_90;
  long local_88;
  long local_80;
  undefined8 uStack_78;
  string local_70;
  string local_50;
  
  uVar4 = name->_M_string_length;
  if (2 < uVar4) {
    ::std::__cxx11::string::substr((ulong)&local_f0,(ulong)name);
    iVar3 = ::std::__cxx11::string::compare((char *)&local_f0);
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    if (iVar3 == 0) {
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
      bVar5 = check_lname(this,&local_50);
      local_e0[0] = local_50.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return bVar5;
      }
      goto LAB_0011d3e5;
    }
    uVar4 = name->_M_string_length;
  }
  if (1 < uVar4) {
    ::std::__cxx11::string::substr((ulong)&local_f0,(ulong)name);
    iVar3 = ::std::__cxx11::string::compare((char *)&local_f0);
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    if (iVar3 == 0) {
      ::std::__cxx11::string::substr((ulong)&local_70,(ulong)name);
      bVar5 = check_sname(this,&local_70);
      local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
      local_e0[0] = local_70.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return bVar5;
      }
      goto LAB_0011d3e5;
    }
  }
  pcVar1 = (this->pname_)._M_dataplus._M_p;
  local_f0 = local_e0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + (this->pname_)._M_string_length);
  if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
    local_b0 = (long *)&local_a0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_f0,(long)local_f0 + local_e8);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_b0,(undefined1 *)(local_a8 + (long)local_b0),local_b0);
    if (local_b0 == (long *)&local_a0) {
      uStack_78 = uStack_98;
      local_90 = &local_80;
    }
    else {
      local_90 = local_b0;
    }
    local_80 = CONCAT71(uStack_9f,local_a0);
    local_88 = local_a8;
    local_a8 = 0;
    local_a0 = 0;
    local_b0 = (long *)&local_a0;
    ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0 != (long *)&local_a0) {
      operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
    }
    pcVar1 = (name->_M_dataplus)._M_p;
    local_d0 = (long *)&local_c0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + name->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_d0,(undefined1 *)(local_c8 + (long)local_d0),local_d0);
    if (local_d0 == (long *)&local_c0) {
      uStack_78 = uStack_b8;
      local_90 = &local_80;
    }
    else {
      local_90 = local_d0;
    }
    local_80 = CONCAT71(uStack_bf,local_c0);
    local_88 = local_c8;
    local_c8 = 0;
    local_c0 = 0;
    local_d0 = (long *)&local_c0;
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_d0 != (long *)&local_c0) {
      operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
    }
  }
  psVar2 = local_f0;
  __n = name->_M_string_length;
  if (__n == local_e8) {
    if (__n == 0) {
      bVar5 = true;
    }
    else {
      iVar3 = bcmp((name->_M_dataplus)._M_p,local_f0,__n);
      bVar5 = iVar3 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  local_50._M_dataplus._M_p = (pointer)psVar2;
  if (psVar2 == local_e0) {
    return bVar5;
  }
LAB_0011d3e5:
  operator_delete(local_50._M_dataplus._M_p,local_e0[0] + 1);
  return bVar5;
}

Assistant:

bool check_name(std::string name) const {

        if(name.length() > 2 && name.substr(0, 2) == "--")
            return check_lname(name.substr(2));
        else if(name.length() > 1 && name.substr(0, 1) == "-")
            return check_sname(name.substr(1));
        else {
            std::string local_pname = pname_;
            if(ignore_case_) {
                local_pname = detail::to_lower(local_pname);
                name = detail::to_lower(name);
            }
            return name == local_pname;
        }
    }